

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_392279::MLKEMTest_Encap768TestVectors_Test::TestBody
          (MLKEMTest_Encap768TestVectors_Test *this)

{
  function<void_(FileTest_*)> local_30;
  MLKEMTest_Encap768TestVectors_Test *local_10;
  MLKEMTest_Encap768TestVectors_Test *this_local;
  
  local_10 = this;
  std::function<void(FileTest*)>::function<void(&)(FileTest*),void>
            ((function<void(FileTest*)> *)&local_30,
             MLKEMEncapFileTest<MLKEM768_public_key,_1184UL,_&MLKEM768_parse_public_key,_1088UL,_&(anonymous_namespace)::wrapper_768_encap_external_entropy>
            );
  FileTestGTest("crypto/mlkem/mlkem768_encap_tests.txt",&local_30);
  std::function<void_(FileTest_*)>::~function(&local_30);
  return;
}

Assistant:

TEST(MLKEMTest, Encap768TestVectors) {
  FileTestGTest(
      "crypto/mlkem/mlkem768_encap_tests.txt",
      MLKEMEncapFileTest<MLKEM768_public_key, MLKEM768_PUBLIC_KEY_BYTES,
                         MLKEM768_parse_public_key, MLKEM768_CIPHERTEXT_BYTES,
                         wrapper_768_encap_external_entropy>);
}